

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

char * __thiscall
btQuantizedBvh::serialize(btQuantizedBvh *this,void *dataBuffer,btSerializer *serializer)

{
  int iVar1;
  uint uVar2;
  btOptimizedBvhNode *pbVar3;
  btQuantizedBvhNode *pbVar4;
  btBvhSubtreeInfo *pbVar5;
  long lVar6;
  long lVar7;
  undefined2 *puVar8;
  btVector3FloatData *dataOut;
  ulong uVar9;
  ulong uVar10;
  
  btVector3::serialize(&this->m_bvhAabbMax,(btVector3FloatData *)((long)dataBuffer + 0x10));
  btVector3::serialize(&this->m_bvhAabbMin,(btVector3FloatData *)dataBuffer);
  btVector3::serialize(&this->m_bvhQuantization,(btVector3FloatData *)((long)dataBuffer + 0x20));
  *(int *)((long)dataBuffer + 0x30) = this->m_curNodeIndex;
  *(uint *)((long)dataBuffer + 0x34) = (uint)this->m_useQuantization;
  iVar1 = (this->m_contiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x38) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x40) = 0;
  }
  else {
    lVar6 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_contiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x40) = lVar6;
    if (lVar6 != 0) {
      uVar2 = (this->m_contiguousNodes).m_size;
      lVar6 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x30,uVar2);
      dataOut = *(btVector3FloatData **)(lVar6 + 8);
      uVar10 = 0;
      uVar9 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 * 0x40 != uVar10; uVar10 = uVar10 + 0x40) {
        btVector3::serialize
                  ((btVector3 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + uVar10),
                   dataOut + 1);
        btVector3::serialize
                  ((btVector3 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + uVar10),
                   dataOut);
        pbVar3 = (this->m_contiguousNodes).m_data;
        *(undefined8 *)dataOut[2].m_floats = *(undefined8 *)(pbVar3->m_padding + (uVar10 - 0xc));
        dataOut[2].m_floats[2] = *(float *)(pbVar3->m_padding + (uVar10 - 4));
        dataOut = dataOut + 3;
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar6,"btOptimizedBvhNodeData",0x59415241);
    }
  }
  iVar1 = (this->m_quantizedContiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x3c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x48) = 0;
  }
  else {
    lVar6 = (**(code **)(*(long *)serializer + 0x38))
                      (serializer,(this->m_quantizedContiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x48) = lVar6;
    if (lVar6 != 0) {
      uVar2 = (this->m_quantizedContiguousNodes).m_size;
      lVar7 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,uVar2);
      lVar6 = *(long *)(lVar7 + 8);
      pbVar4 = (this->m_quantizedContiguousNodes).m_data;
      uVar10 = 0;
      uVar9 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
        *(undefined4 *)(lVar6 + 0xc + uVar10) =
             *(undefined4 *)((long)pbVar4->m_quantizedAabbMax + uVar10 + 6);
        *(undefined2 *)(lVar6 + 6 + uVar10) =
             *(undefined2 *)((long)pbVar4->m_quantizedAabbMax + uVar10);
        *(undefined2 *)(lVar6 + 8 + uVar10) =
             *(undefined2 *)((long)pbVar4->m_quantizedAabbMax + uVar10 + 2);
        *(undefined2 *)(lVar6 + 10 + uVar10) =
             *(undefined2 *)((long)pbVar4->m_quantizedAabbMax + uVar10 + 4);
        *(undefined2 *)(lVar6 + uVar10) = *(undefined2 *)((long)pbVar4->m_quantizedAabbMin + uVar10)
        ;
        *(undefined2 *)(lVar6 + 2 + uVar10) =
             *(undefined2 *)((long)pbVar4->m_quantizedAabbMin + uVar10 + 2);
        *(undefined2 *)(lVar6 + 4 + uVar10) =
             *(undefined2 *)((long)pbVar4->m_quantizedAabbMin + uVar10 + 4);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar7,"btQuantizedBvhNodeData",0x59415241);
    }
  }
  *(btTraversalMode *)((long)dataBuffer + 0x58) = this->m_traversalMode;
  iVar1 = (this->m_SubtreeHeaders).m_size;
  *(int *)((long)dataBuffer + 0x5c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x50) = 0;
  }
  else {
    lVar6 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_SubtreeHeaders).m_data);
    *(long *)((long)dataBuffer + 0x50) = lVar6;
    if (lVar6 != 0) {
      uVar2 = (this->m_SubtreeHeaders).m_size;
      lVar6 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x14,uVar2);
      pbVar5 = (this->m_SubtreeHeaders).m_data;
      uVar10 = 0;
      uVar9 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar9 = uVar10;
      }
      puVar8 = (undefined2 *)(*(long *)(lVar6 + 8) + 0x12);
      for (; uVar9 * 0x20 != uVar10; uVar10 = uVar10 + 0x20) {
        puVar8[-2] = *(undefined2 *)((long)pbVar5->m_quantizedAabbMax + uVar10);
        puVar8[-1] = *(undefined2 *)((long)pbVar5->m_quantizedAabbMax + uVar10 + 2);
        *puVar8 = *(undefined2 *)((long)pbVar5->m_quantizedAabbMax + uVar10 + 4);
        puVar8[-5] = *(undefined2 *)((long)pbVar5->m_quantizedAabbMin + uVar10);
        puVar8[-4] = *(undefined2 *)((long)pbVar5->m_quantizedAabbMin + uVar10 + 2);
        puVar8[-3] = *(undefined2 *)((long)pbVar5->m_quantizedAabbMin + uVar10 + 4);
        *(undefined8 *)(puVar8 + -9) =
             *(undefined8 *)((long)pbVar5->m_quantizedAabbMax + uVar10 + 6);
        puVar8 = puVar8 + 10;
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar6,"btBvhSubtreeInfoData",0x59415241);
    }
  }
  return "btQuantizedBvhFloatData";
}

Assistant:

const char*	btQuantizedBvh::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btQuantizedBvhData* quantizedData = (btQuantizedBvhData*)dataBuffer;
	
	m_bvhAabbMax.serialize(quantizedData->m_bvhAabbMax);
	m_bvhAabbMin.serialize(quantizedData->m_bvhAabbMin);
	m_bvhQuantization.serialize(quantizedData->m_bvhQuantization);

	quantizedData->m_curNodeIndex = m_curNodeIndex;
	quantizedData->m_useQuantization = m_useQuantization;
	
	quantizedData->m_numContiguousLeafNodes = m_contiguousNodes.size();
	quantizedData->m_contiguousNodesPtr = (btOptimizedBvhNodeData*) (m_contiguousNodes.size() ? serializer->getUniquePointer((void*)&m_contiguousNodes[0]) : 0);
	if (quantizedData->m_contiguousNodesPtr)
	{
		int sz = sizeof(btOptimizedBvhNodeData);
		int numElem = m_contiguousNodes.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btOptimizedBvhNodeData* memPtr = (btOptimizedBvhNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_contiguousNodes[i].m_aabbMaxOrg.serialize(memPtr->m_aabbMaxOrg);
			m_contiguousNodes[i].m_aabbMinOrg.serialize(memPtr->m_aabbMinOrg);
			memPtr->m_escapeIndex = m_contiguousNodes[i].m_escapeIndex;
			memPtr->m_subPart = m_contiguousNodes[i].m_subPart;
			memPtr->m_triangleIndex = m_contiguousNodes[i].m_triangleIndex;
		}
		serializer->finalizeChunk(chunk,"btOptimizedBvhNodeData",BT_ARRAY_CODE,(void*)&m_contiguousNodes[0]);
	}

	quantizedData->m_numQuantizedContiguousNodes = m_quantizedContiguousNodes.size();
//	printf("quantizedData->m_numQuantizedContiguousNodes=%d\n",quantizedData->m_numQuantizedContiguousNodes);
	quantizedData->m_quantizedContiguousNodesPtr =(btQuantizedBvhNodeData*) (m_quantizedContiguousNodes.size() ? serializer->getUniquePointer((void*)&m_quantizedContiguousNodes[0]) : 0);
	if (quantizedData->m_quantizedContiguousNodesPtr)
	{
		int sz = sizeof(btQuantizedBvhNodeData);
		int numElem = m_quantizedContiguousNodes.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btQuantizedBvhNodeData* memPtr = (btQuantizedBvhNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex;
			memPtr->m_quantizedAabbMax[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[2];
		}
		serializer->finalizeChunk(chunk,"btQuantizedBvhNodeData",BT_ARRAY_CODE,(void*)&m_quantizedContiguousNodes[0]);
	}

	quantizedData->m_traversalMode = int(m_traversalMode);
	quantizedData->m_numSubtreeHeaders = m_SubtreeHeaders.size();

	quantizedData->m_subTreeInfoPtr = (btBvhSubtreeInfoData*) (m_SubtreeHeaders.size() ? serializer->getUniquePointer((void*)&m_SubtreeHeaders[0]) : 0);
	if (quantizedData->m_subTreeInfoPtr)
	{
		int sz = sizeof(btBvhSubtreeInfoData);
		int numElem = m_SubtreeHeaders.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btBvhSubtreeInfoData* memPtr = (btBvhSubtreeInfoData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_quantizedAabbMax[0] = m_SubtreeHeaders[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_SubtreeHeaders[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_SubtreeHeaders[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_SubtreeHeaders[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_SubtreeHeaders[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_SubtreeHeaders[i].m_quantizedAabbMin[2];

			memPtr->m_rootNodeIndex = m_SubtreeHeaders[i].m_rootNodeIndex;
			memPtr->m_subtreeSize = m_SubtreeHeaders[i].m_subtreeSize;
		}
		serializer->finalizeChunk(chunk,"btBvhSubtreeInfoData",BT_ARRAY_CODE,(void*)&m_SubtreeHeaders[0]);
	}
	return btQuantizedBvhDataName;
}